

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_phys.c
# Opt level: O3

REF_STATUS ref_phys_wall_distance_static(REF_GRID ref_grid,REF_DICT ref_dict,REF_DBL *distance)

{
  REF_INT item;
  REF_MPI ref_mpi;
  REF_NODE pRVar1;
  REF_GLOB *pRVar2;
  uint uVar3;
  REF_INT *pRVar4;
  long lVar5;
  undefined8 uVar6;
  int iVar7;
  char *pcVar8;
  uint uVar9;
  REF_DBL *pRVar10;
  long lVar11;
  REF_INT part_complete;
  REF_INT ncell;
  REF_DBL *xyz;
  REF_SEARCH ref_search;
  REF_INT local_node_per;
  REF_INT local_ncell;
  REF_DBL radius;
  REF_DBL *local_xyz;
  REF_DBL center [3];
  uint uVar12;
  REF_DBL *local_b8;
  REF_DBL *local_b0;
  ulong local_a8;
  REF_NODE local_a0;
  REF_SEARCH local_98;
  int local_8c;
  uint local_88;
  REF_INT local_84;
  REF_INT *local_80;
  REF_INT *local_78;
  REF_DBL *local_70;
  REF_MPI local_68;
  REF_DBL *local_60;
  double local_58;
  REF_DBL *local_50;
  REF_DBL local_48 [3];
  
  ref_mpi = ref_grid->mpi;
  pRVar1 = ref_grid->node;
  uVar9 = (ref_grid->twod == 0) + 2;
  iVar7 = pRVar1->max;
  if (0 < (long)iVar7) {
    pRVar2 = pRVar1->global;
    lVar5 = 0;
    do {
      if (-1 < pRVar2[lVar5]) {
        distance[lVar5] = 1e+200;
      }
      lVar5 = lVar5 + 1;
    } while (iVar7 != lVar5);
  }
  uVar3 = ref_phys_local_wall(ref_grid,ref_dict,(REF_INT *)&local_88,&local_84,&local_50);
  if (uVar3 == 0) {
    if (uVar9 == local_88) {
      if (-1 < (long)ref_mpi->n) {
        pRVar4 = (REF_INT *)malloc((long)ref_mpi->n << 2);
        if (pRVar4 == (REF_INT *)0x0) {
          pcVar8 = "malloc part_ncell of REF_INT NULL";
          uVar6 = 0x687;
LAB_0019fc86:
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",
                 uVar6,"ref_phys_wall_distance_static",pcVar8);
          return 2;
        }
        local_80 = pRVar4;
        uVar3 = ref_mpi_allgather(ref_mpi,&local_84,pRVar4,1);
        if (uVar3 == 0) {
          uVar12 = 0;
          pRVar10 = local_50;
          if (0 < ref_mpi->n) {
            local_8c = uVar9 * 3;
            local_70 = local_50;
            local_a8 = (ulong)uVar9;
            local_a0 = pRVar1;
            local_68 = ref_mpi;
            do {
              local_b8 = (REF_DBL *)0x0;
              uVar9 = 0;
              uVar3 = ref_phys_bcast_parts
                                (local_68,(REF_INT *)&stack0xffffffffffffff40,local_80,
                                 (REF_INT)local_a8,(REF_INT)local_70,
                                 (REF_DBL *)&stack0xffffffffffffff44,(REF_INT *)&local_b8,
                                 (REF_DBL **)(ulong)uVar12);
              if (uVar3 != 0) {
                pcVar8 = "bcast part";
                uVar6 = 0x699;
                goto LAB_0019fb75;
              }
              local_b0 = (REF_DBL *)(ulong)uVar9;
              uVar3 = ref_search_create(&local_98,uVar9);
              pRVar10 = local_b0;
              if (uVar3 != 0) {
                pcVar8 = "make search";
                uVar6 = 0x69d;
                goto LAB_0019fb75;
              }
              iVar7 = (int)local_b0;
              if (iVar7 < 0) {
                pcVar8 = "malloc permutation of REF_INT negative";
                uVar6 = 0x69e;
                goto LAB_0019fc45;
              }
              pRVar4 = (REF_INT *)malloc((long)local_b0 * 4);
              if (pRVar4 == (REF_INT *)0x0) {
                pcVar8 = "malloc permutation of REF_INT NULL";
                uVar6 = 0x69e;
                goto LAB_0019fc86;
              }
              local_78 = pRVar4;
              uVar3 = ref_sort_shuffle(iVar7,pRVar4);
              if (uVar3 != 0) {
                pcVar8 = "shuffle";
                uVar6 = 0x69f;
                goto LAB_0019fb75;
              }
              if (pRVar10 != (REF_DBL *)0x0) {
                local_60 = local_b8;
                pRVar10 = (REF_DBL *)0x0;
                do {
                  item = local_78[(long)pRVar10];
                  uVar3 = ref_node_bounding_sphere_xyz
                                    (local_60 + local_8c * item,(REF_INT)local_a8,local_48,&local_58
                                    );
                  if (uVar3 != 0) {
                    pcVar8 = "bound";
                    uVar6 = 0x6a4;
                    goto LAB_0019fb75;
                  }
                  uVar3 = ref_search_insert(local_98,item,local_48,local_58 * 1.00000001);
                  if (uVar3 != 0) {
                    pcVar8 = "ins";
                    uVar6 = 0x6a5;
                    goto LAB_0019fb75;
                  }
                  pRVar10 = (REF_DBL *)((long)pRVar10 + 1);
                } while (local_b0 != pRVar10);
              }
              free(local_78);
              iVar7 = local_a0->max;
              if (0 < iVar7) {
                local_b0 = local_b8;
                lVar11 = 0;
                lVar5 = 0;
                pRVar10 = distance;
                do {
                  if (-1 < local_a0->global[lVar5]) {
                    uVar3 = ref_search_nearest_element
                                      (local_98,(REF_INT)local_a8,local_b0,
                                       (REF_DBL *)((long)ref_grid->node->real + lVar11),pRVar10);
                    if (uVar3 != 0) {
                      pcVar8 = "candidates";
                      uVar6 = 0x6b5;
                      goto LAB_0019fb75;
                    }
                    iVar7 = local_a0->max;
                  }
                  lVar5 = lVar5 + 1;
                  lVar11 = lVar11 + 0x78;
                  pRVar10 = pRVar10 + 1;
                } while (lVar5 < iVar7);
              }
              uVar3 = ref_search_free(local_98);
              if (uVar3 != 0) {
                pcVar8 = "free";
                uVar6 = 0x6b7;
                goto LAB_0019fb75;
              }
              if (local_b8 != (REF_DBL *)0x0) {
                free(local_b8);
              }
              pRVar10 = local_70;
            } while ((int)uVar12 < local_68->n);
          }
          free(local_80);
          if (pRVar10 == (REF_DBL *)0x0) {
            return 0;
          }
          free(pRVar10);
          return 0;
        }
        pcVar8 = "allgather part ncell";
        uVar6 = 0x689;
        goto LAB_0019fb75;
      }
      pcVar8 = "malloc part_ncell of REF_INT negative";
      uVar6 = 0x687;
LAB_0019fc45:
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",uVar6,
             "ref_phys_wall_distance_static",pcVar8);
    }
    else {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",0x685,
             "ref_phys_wall_distance_static","node_per miss match",(ulong)uVar9,(long)(int)local_88)
      ;
    }
    uVar3 = 1;
  }
  else {
    pcVar8 = "local wall";
    uVar6 = 0x684;
LAB_0019fb75:
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",uVar6,
           "ref_phys_wall_distance_static",(ulong)uVar3,pcVar8);
  }
  return uVar3;
}

Assistant:

REF_FCN REF_STATUS ref_phys_wall_distance_static(REF_GRID ref_grid,
                                                 REF_DICT ref_dict,
                                                 REF_DBL *distance) {
  REF_MPI ref_mpi = ref_grid_mpi(ref_grid);
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_INT ncell, local_ncell, *part_ncell, part_complete, max_ncell;
  REF_DBL *local_xyz, *xyz;
  REF_INT local_node_per, node_per;
  REF_INT node, cell;
  REF_INT *permutation, i;
  REF_SEARCH ref_search;
  REF_DBL center[3], radius;
  REF_DBL scale = 1.0 + 1.0e-8;
  REF_BOOL timing = REF_FALSE;

  if (timing) ref_mpi_stopwatch_start(ref_mpi);

  if (ref_grid_twod(ref_grid)) {
    node_per = 2;
  } else {
    node_per = 3;
  }

  each_ref_node_valid_node(ref_node, node) { distance[node] = REF_DBL_MAX; }

  RSS(ref_phys_local_wall(ref_grid, ref_dict, &local_node_per, &local_ncell,
                          &local_xyz),
      "local wall");
  REIS(node_per, local_node_per, "node_per miss match");

  ref_malloc(part_ncell, ref_mpi_n(ref_mpi), REF_INT);
  RSS(ref_mpi_allgather(ref_mpi, &local_ncell, part_ncell, REF_INT_TYPE),
      "allgather part ncell");
  if (timing && ref_mpi_once(ref_mpi)) {
    for (i = 0; i < ref_mpi_n(ref_mpi); i++) {
      printf("%d part %d ncell\n", i, part_ncell[i]);
    }
  }
  if (timing) ref_mpi_stopwatch_stop(ref_mpi, "wall dist init");

  max_ncell = 1000000; /* (8 * 3 * node_per) bytes per element */

  part_complete = 0;
  while (part_complete < ref_mpi_n(ref_mpi)) {
    xyz = NULL;
    ncell = 0;
    RSS(ref_phys_bcast_parts(ref_mpi, &part_complete, part_ncell, max_ncell,
                             node_per, local_xyz, &ncell, &xyz),
        "bcast part");

    if (timing) ref_mpi_stopwatch_stop(ref_mpi, "form-scatter");

    RSS(ref_search_create(&ref_search, ncell), "make search");
    ref_malloc(permutation, ncell, REF_INT);
    RSS(ref_sort_shuffle(ncell, permutation), "shuffle");
    for (i = 0; i < ncell; i++) {
      cell = permutation[i];
      RSS(ref_node_bounding_sphere_xyz(&(xyz[3 * node_per * cell]), node_per,
                                       center, &radius),
          "bound");
      RSS(ref_search_insert(ref_search, cell, center, scale * radius), "ins");
    }
    ref_free(permutation);
    if (timing) ref_mpi_stopwatch_stop(ref_mpi, "create-insert");
    if (timing && ref_mpi_once(ref_mpi)) {
      REF_INT depth;
      RSS(ref_search_depth(ref_search, &depth), "depth");
      printf("ncell %d depth %d\n", ncell, depth);
    }
    if (timing) ref_mpi_stopwatch_stop(ref_mpi, "depth");

    each_ref_node_valid_node(ref_node, node) {
      RSS(ref_search_nearest_element(
              ref_search, node_per, xyz,
              ref_node_xyz_ptr(ref_grid_node(ref_grid), node),
              &(distance[node])),
          "candidates");
    }
    RSS(ref_search_free(ref_search), "free");

    ref_free(xyz);
    if (timing) ref_mpi_stopwatch_stop(ref_mpi, "min(dist)");
  }

  ref_free(part_ncell);
  ref_free(local_xyz);
  return REF_SUCCESS;
}